

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O1

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::PipelineResourceSignatureBase
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,RenderDeviceImplType *pDevice,
          PipelineResourceSignatureDesc *Desc,SHADER_TYPE ShaderStages,bool bIsDeviceInternal)

{
  PIPELINE_TYPE PVar1;
  Int32 IVar2;
  uint uVar3;
  IMemoryAllocator *pIVar4;
  SHADER_RESOURCE_VARIABLE_TYPE *pSVar5;
  ulong uVar6;
  SHADER_TYPE ShaderType;
  SHADER_TYPE SVar7;
  uint uVar8;
  bool bVar9;
  string msg;
  string local_48;
  
  DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).super_ObjectBase<Diligent::IPipelineResourceSignature>.
  super_RefCountedObject<Diligent::IPipelineResourceSignature>.super_IPipelineResourceSignature.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_009363e8;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Tuple_impl<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<1UL,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>,_false>._M_head_impl
       = (STDDeleter<void,_Diligent::IMemoryAllocator>)0x0;
  (this->m_pRawMemory)._M_t.
  super___uniq_ptr_impl<void,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>._M_t.
  super__Tuple_impl<0UL,_void_*,_Diligent::STDDeleter<void,_Diligent::IMemoryAllocator>_>.
  super__Head_base<0UL,_void_*,_false>._M_head_impl = (void *)0x0;
  this->m_pResourceAttribs = (PipelineResourceAttribsType *)0x0;
  this->m_pImmutableSamplerAttribs = (ImmutableSamplerAttribsType *)0x0;
  this->m_pImmutableSamplers = (RefCntAutoPtr<Diligent::SamplerVkImpl> *)0x0;
  this->m_pStaticResCache = (ShaderResourceCacheImplType *)0x0;
  this->m_StaticVarsMgrs = (ShaderVariableManagerImplType *)0x0;
  this->m_Hash = 0;
  *(undefined8 *)(this->m_ResourceOffsets)._M_elems = 0;
  this->m_ShaderStages = ShaderStages;
  this->m_StaticResShaderStages = SHADER_TYPE_UNKNOWN;
  this->m_PipelineType = PIPELINE_TYPE_INVALID;
  (this->m_StaticResStageIndex)._M_elems[0] = -1;
  (this->m_StaticResStageIndex)._M_elems[1] = -1;
  (this->m_StaticResStageIndex)._M_elems[2] = -1;
  (this->m_StaticResStageIndex)._M_elems[2] = -1;
  (this->m_StaticResStageIndex)._M_elems[3] = -1;
  (this->m_StaticResStageIndex)._M_elems[4] = -1;
  (this->m_StaticResStageIndex)._M_elems[5] = -1;
  pIVar4 = GetRawAllocator();
  (this->m_SRBMemAllocator).m_RawMemAllocator = pIVar4;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.Resources = (PipelineResourceDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.ImmutableSamplers = (ImmutableSamplerDesc *)0x0;
  (this->
  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
  ).m_Desc.CombinedSamplerSuffix = (Char *)0x0;
  (this->m_SRBMemAllocator).m_DataAllocators = (FixedBlockMemoryAllocator *)0x0;
  (this->m_SRBMemAllocator).m_ShaderVariableDataAllocatorCount = 0;
  (this->m_SRBMemAllocator).m_ResourceCacheDataAllocatorCount = 0;
  this->m_IsDestructed = false;
  ValidatePipelineResourceSignatureDesc(Desc,(IRenderDevice *)pDevice,RENDER_DEVICE_TYPE_VULKAN);
  if (Desc->NumResources != 0) {
    pSVar5 = &Desc->Resources->VarType;
    uVar6 = 0;
    do {
      SVar7 = *(SHADER_TYPE *)(pSVar5 + -9);
      this->m_ShaderStages = this->m_ShaderStages | SVar7;
      if (*pSVar5 == SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
        this->m_StaticResShaderStages = this->m_StaticResShaderStages | SVar7;
      }
      uVar6 = uVar6 + 1;
      pSVar5 = pSVar5 + 0x18;
    } while (uVar6 < Desc->NumResources);
  }
  if (this->m_ShaderStages != SHADER_TYPE_UNKNOWN) {
    PVar1 = PipelineTypeFromShaderStages(this->m_ShaderStages);
    this->m_PipelineType = PVar1;
    if (PVar1 == PIPELINE_TYPE_INVALID) {
      FormatString<char[50]>
                (&local_48,(char (*) [50])"Failed to deduce pipeline type from shader stages");
      DebugAssertionFailed
                (local_48._M_dataplus._M_p,"PipelineResourceSignatureBase",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x18d);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
    }
  }
  uVar8 = 0;
  SVar7 = this->m_StaticResShaderStages;
  if (this->m_StaticResShaderStages != SHADER_TYPE_UNKNOWN) {
    do {
      ShaderType = -SVar7 & SVar7;
      IVar2 = GetShaderTypePipelineIndex(ShaderType,this->m_PipelineType);
      (this->m_StaticResStageIndex)._M_elems[IVar2] = (char)uVar8;
      uVar8 = uVar8 + 1;
      bVar9 = ShaderType != SVar7;
      SVar7 = ShaderType ^ SVar7;
    } while (bVar9);
  }
  uVar3 = this->m_StaticResShaderStages - (this->m_StaticResShaderStages >> 1 & 0x55555555);
  uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
  uVar3 = (uVar3 >> 4) + uVar3 & 0xf0f0f0f;
  if (uVar8 != uVar3 * 0x1010101 >> 0x18) {
    FormatString<char[26],char[45]>
              (&local_48,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"StaticVarStageIdx == GetNumStaticResStages()",
               (char (*) [45])(ulong)uVar3);
    DebugAssertionFailed
              (local_48._M_dataplus._M_p,"PipelineResourceSignatureBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

PipelineResourceSignatureBase(IReferenceCounters*                  pRefCounters,
                                  RenderDeviceImplType*                pDevice,
                                  const PipelineResourceSignatureDesc& Desc,
                                  SHADER_TYPE                          ShaderStages      = SHADER_TYPE_UNKNOWN,
                                  bool                                 bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal},
        m_ShaderStages{ShaderStages},
        m_SRBMemAllocator{GetRawAllocator()}
    {
        // Don't read from m_Desc until it was allocated and copied in CopyPipelineResourceSignatureDesc()
        this->m_Desc.Resources             = nullptr;
        this->m_Desc.ImmutableSamplers     = nullptr;
        this->m_Desc.CombinedSamplerSuffix = nullptr;

        ValidatePipelineResourceSignatureDesc(Desc, pDevice, EngineImplTraits::DeviceType);

        // Determine shader stages that have any resources as well as
        // shader stages that have static resources.
        for (Uint32 i = 0; i < Desc.NumResources; ++i)
        {
            const PipelineResourceDesc& ResDesc = Desc.Resources[i];

            m_ShaderStages |= ResDesc.ShaderStages;
            if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC)
                m_StaticResShaderStages |= ResDesc.ShaderStages;
        }

        if (m_ShaderStages != SHADER_TYPE_UNKNOWN)
        {
            m_PipelineType = PipelineTypeFromShaderStages(m_ShaderStages);
            DEV_CHECK_ERR(m_PipelineType != PIPELINE_TYPE_INVALID, "Failed to deduce pipeline type from shader stages");
        }

        {
            Uint32 StaticVarStageIdx = 0;
            for (SHADER_TYPE StaticResStages = m_StaticResShaderStages; StaticResStages != SHADER_TYPE_UNKNOWN; ++StaticVarStageIdx)
            {
                const SHADER_TYPE StageBit           = ExtractLSB(StaticResStages);
                const Int32       ShaderTypeInd      = GetShaderTypePipelineIndex(StageBit, m_PipelineType);
                m_StaticResStageIndex[ShaderTypeInd] = static_cast<Int8>(StaticVarStageIdx);
            }
            VERIFY_EXPR(StaticVarStageIdx == GetNumStaticResStages());
        }
    }